

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

void __thiscall mkvparser::Cues::~Cues(Cues *this)

{
  long lVar1;
  long lVar2;
  void *pvVar3;
  CuePoint **ppCVar4;
  long lVar5;
  
  ppCVar4 = this->m_cue_points;
  lVar1 = this->m_count;
  lVar2 = this->m_preload_count;
  if (ppCVar4 != ppCVar4 + lVar1 + lVar2) {
    lVar5 = 0;
    do {
      pvVar3 = *(void **)((long)ppCVar4 + lVar5);
      if (pvVar3 == (void *)0x0) {
        __assert_fail("pCP",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x73d,"mkvparser::Cues::~Cues()");
      }
      if (*(void **)((long)pvVar3 + 0x20) != (void *)0x0) {
        operator_delete__(*(void **)((long)pvVar3 + 0x20));
      }
      operator_delete(pvVar3);
      lVar5 = lVar5 + 8;
    } while (lVar2 * 8 + lVar1 * 8 != lVar5);
    ppCVar4 = this->m_cue_points;
  }
  if (ppCVar4 != (CuePoint **)0x0) {
    operator_delete__(ppCVar4);
    return;
  }
  return;
}

Assistant:

Cues::~Cues() {
  const long n = m_count + m_preload_count;

  CuePoint** p = m_cue_points;
  CuePoint** const q = p + n;

  while (p != q) {
    CuePoint* const pCP = *p++;
    assert(pCP);

    delete pCP;
  }

  delete[] m_cue_points;
}